

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3MemdbInit(void)

{
  int iVar1;
  sqlite3_vfs *psVar2;
  
  psVar2 = sqlite3_vfs_find((char *)0x0);
  if (psVar2 != (sqlite3_vfs *)0x0) {
    memdb_vfs.szOsFile = 0x18;
    if (0x18 < (uint)psVar2->szOsFile) {
      memdb_vfs.szOsFile = psVar2->szOsFile;
    }
    memdb_vfs.pAppData = psVar2;
    iVar1 = sqlite3_vfs_register(&memdb_vfs,0);
    return iVar1;
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3MemdbInit(void){
  sqlite3_vfs *pLower = sqlite3_vfs_find(0);
  unsigned int sz;
  if( NEVER(pLower==0) ) return SQLITE_ERROR;
  sz = pLower->szOsFile;
  memdb_vfs.pAppData = pLower;
  /* The following conditional can only be true when compiled for
  ** Windows x86 and SQLITE_MAX_MMAP_SIZE=0.  We always leave
  ** it in, to be safe, but it is marked as NO_TEST since there
  ** is no way to reach it under most builds. */
  if( sz<sizeof(MemFile) ) sz = sizeof(MemFile); /*NO_TEST*/
  memdb_vfs.szOsFile = sz;
  return sqlite3_vfs_register(&memdb_vfs, 0);
}